

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (String *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lhs,char *op,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rhs)

{
  ostream *poVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  poVar1 = tlssPush();
  test_detail::
  print_range<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,burst::identity_fn>
            (poVar1,this);
  tlssPop();
  String::String(&local_68,(char *)lhs);
  operator+(&local_38,&local_50,&local_68);
  poVar1 = tlssPush();
  test_detail::
  print_range<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,burst::identity_fn>
            (poVar1,op);
  tlssPop();
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }